

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O0

bool __thiscall tinyusdz::StreamReader::read_double(StreamReader *this,double *ret)

{
  bool bVar1;
  uint64_t local_28;
  double value;
  double *ret_local;
  StreamReader *this_local;
  
  if (ret == (double *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = 0;
    value = (double)ret;
    ret_local = (double *)this;
    bVar1 = read8(this,&local_28);
    if (bVar1) {
      *(uint64_t *)value = local_28;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool read_double(double *ret) const {
    if (!ret) {
      return false;
    }

    double value{};
    if (!read8(reinterpret_cast<uint64_t *>(&value))) {
      return false;
    }

    (*ret) = value;

    return true;
  }